

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.hxx
# Opt level: O2

void __thiscall nuraft::cluster_config::~cluster_config(cluster_config *this)

{
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ::_M_clear(&(this->servers_).
              super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            );
  std::__cxx11::string::~string((string *)&this->user_ctx_);
  return;
}

Assistant:

~cluster_config() {
    }